

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

void xc_func_set_ext_params(xc_func_type *p,double *ext_params)

{
  uint uVar1;
  xc_func_info_type *pxVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  pxVar2 = p->info;
  uVar1 = (pxVar2->ext_params).n;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar5 = ext_params[uVar4];
    if ((dVar5 == -999998888.0) && (!NAN(dVar5))) {
      dVar5 = (pxVar2->ext_params).values[uVar4];
    }
    p->ext_params[uVar4] = dVar5;
  }
  (*(pxVar2->ext_params).set)(p,p->ext_params);
  return;
}

Assistant:

void
xc_func_set_ext_params(xc_func_type *p, const double *ext_params)
{
  int ii;

  assert(p->info->ext_params.n > 0);
  /* We always store the current parameters in the functional instance */
  for(ii=0; ii<p->info->ext_params.n; ii++)
    p->ext_params[ii] = (ext_params[ii] == XC_EXT_PARAMS_DEFAULT) ? p->info->ext_params.values[ii] : ext_params[ii];
  /* Update the parameters */
  p->info->ext_params.set(p, p->ext_params);
}